

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O0

int ExtractAlpha_C(uint8_t *argb,int argb_stride,int width,int height,uint8_t *alpha,
                  int alpha_stride)

{
  byte bVar1;
  uint8_t alpha_value;
  int j;
  int i;
  uint8_t alpha_mask;
  int alpha_stride_local;
  uint8_t *alpha_local;
  int height_local;
  int width_local;
  int argb_stride_local;
  uint8_t *argb_local;
  
  alpha_mask = 0xff;
  alpha_local = alpha;
  argb_local = argb;
  for (j = 0; j < height; j = j + 1) {
    for (i = 0; i < width; i = i + 1) {
      bVar1 = argb_local[i << 2];
      alpha_local[i] = bVar1;
      alpha_mask = alpha_mask & bVar1;
    }
    argb_local = argb_local + argb_stride;
    alpha_local = alpha_local + alpha_stride;
  }
  return (int)(alpha_mask == 0xff);
}

Assistant:

static int ExtractAlpha_C(const uint8_t* WEBP_RESTRICT argb, int argb_stride,
                          int width, int height,
                          uint8_t* WEBP_RESTRICT alpha, int alpha_stride) {
  uint8_t alpha_mask = 0xff;
  int i, j;

  for (j = 0; j < height; ++j) {
    for (i = 0; i < width; ++i) {
      const uint8_t alpha_value = argb[4 * i];
      alpha[i] = alpha_value;
      alpha_mask &= alpha_value;
    }
    argb += argb_stride;
    alpha += alpha_stride;
  }
  return (alpha_mask == 0xff);
}